

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::SetProtocol(BasePort *this,ProtocolType prot)

{
  char cVar1;
  ProtocolType PVar2;
  long *plVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  
  if (prot == PROTOCOL_SEQ_RW) {
    poVar4 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"BasePort::SetProtocol: system running in NON broadcast mode",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    this->Protocol_ = PROTOCOL_SEQ_RW;
    PVar2 = PROTOCOL_SEQ_RW;
LAB_00110833:
    bVar7 = PVar2 == prot;
  }
  else {
    if (this->IsAllBoardsBroadcastCapable_ == false) {
      poVar4 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"BasePort::SetProtocol",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      poVar4 = (ostream *)std::ostream::flush();
      pcVar6 = "***Error: not all boards support broadcasting, ";
      lVar5 = 0x2f;
    }
    else {
      if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
         (this->IsAllBoardsRev8_9_ != false)) {
        poVar4 = this->outStr;
        cVar1 = (char)poVar4;
        if (prot == PROTOCOL_SEQ_R_BC_W) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"BasePort::SetProtocol: system running with broadcast write",0x3a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
          PVar2 = PROTOCOL_SEQ_R_BC_W;
        }
        else if (prot == PROTOCOL_BC_QRW) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "BasePort::SetProtocol: system running with broadcast query, read, and write",
                     0x4b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          this->Protocol_ = PROTOCOL_BC_QRW;
          PVar2 = PROTOCOL_BC_QRW;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"BasePort::SetProtocol: warning: unknown protocol (ignored): ",0x3c);
          plVar3 = (long *)std::ostream::operator<<((ostream *)poVar4,prot);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
          PVar2 = this->Protocol_;
        }
        goto LAB_00110833;
      }
      poVar4 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"BasePort::SetProtocol",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      poVar4 = (ostream *)std::ostream::flush();
      pcVar6 = "***Error: cannot use broadcast mode with this mix of firmware, ";
      lVar5 = 0x3f;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"          please upgrade your firmware",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool BasePort::SetProtocol(ProtocolType prot) {
    if (prot != BasePort::PROTOCOL_SEQ_RW) {
        if (!IsAllBoardsBroadcastCapable_) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: not all boards support broadcasting, " << std::endl
                   << "          please upgrade your firmware"  << std::endl;
            return false;
        }
        if (!IsBroadcastFirmwareMixValid()) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: cannot use broadcast mode with this mix of firmware, " << std::endl
                   << "          please upgrade your firmware" << std::endl;
            return false;
        }
    }
    switch (prot) {
        case BasePort::PROTOCOL_SEQ_RW:
            outStr << "BasePort::SetProtocol: system running in NON broadcast mode" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_SEQ_R_BC_W:
            outStr << "BasePort::SetProtocol: system running with broadcast write" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_BC_QRW:
            outStr << "BasePort::SetProtocol: system running with broadcast query, read, and write" << std::endl;
            Protocol_ = prot;
            break;
        default:
            outStr << "BasePort::SetProtocol: warning: unknown protocol (ignored): " << prot << std::endl;
            break;
    }
    return (Protocol_ == prot);
}